

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O0

XrResult ApiDumpLayerXrDestroyEyeTrackerFB(XrEyeTrackerFB eyeTracker)

{
  bool bVar1;
  pointer ppVar2;
  ostream *this;
  undefined1 local_248 [8];
  unique_lock<std::mutex> lock;
  _Node_iterator_base<std::pair<XrEyeTrackerFB_T_*const,_XrGeneratedDispatchTable_*>,_false>
  local_230;
  iterator exists;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210 [32];
  ostringstream local_1f0 [8];
  ostringstream oss_eyeTracker;
  _Node_iterator_base<std::pair<XrEyeTrackerFB_T_*const,_XrGeneratedDispatchTable_*>,_false>
  local_70;
  _Node_iterator_base<std::pair<XrEyeTrackerFB_T_*const,_XrGeneratedDispatchTable_*>,_false>
  local_68;
  iterator map_iter;
  undefined1 local_50 [8];
  unique_lock<std::mutex> mlock;
  XrGeneratedDispatchTable *gen_dispatch_table;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  XrEyeTrackerFB pXStack_18;
  XrResult result;
  XrEyeTrackerFB eyeTracker_local;
  
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  pXStack_18 = eyeTracker;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&gen_dispatch_table);
  mlock._M_owns = false;
  mlock._9_7_ = 0;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_50,&g_eyetrackerfb_dispatch_mutex);
  local_68._M_cur =
       (__node_type *)
       std::
       unordered_map<XrEyeTrackerFB_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrEyeTrackerFB_T_*>,_std::equal_to<XrEyeTrackerFB_T_*>,_std::allocator<std::pair<XrEyeTrackerFB_T_*const,_XrGeneratedDispatchTable_*>_>_>
       ::find(&g_eyetrackerfb_dispatch_map,&stack0xffffffffffffffe8);
  local_70._M_cur =
       (__node_type *)
       std::
       unordered_map<XrEyeTrackerFB_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrEyeTrackerFB_T_*>,_std::equal_to<XrEyeTrackerFB_T_*>,_std::allocator<std::pair<XrEyeTrackerFB_T_*const,_XrGeneratedDispatchTable_*>_>_>
       ::end(&g_eyetrackerfb_dispatch_map);
  bVar1 = std::__detail::operator==(&local_68,&local_70);
  if (bVar1) {
    eyeTracker_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<XrEyeTrackerFB_T_*const,_XrGeneratedDispatchTable_*>,_false,_false>
             ::operator->((_Node_iterator<std::pair<XrEyeTrackerFB_T_*const,_XrGeneratedDispatchTable_*>,_false,_false>
                           *)&local_68);
    mlock._8_8_ = ppVar2->second;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_50);
  if (!bVar1) {
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[22],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&gen_dispatch_table,(char (*) [9])"XrResult",
               (char (*) [22])"xrDestroyEyeTrackerFB",(char (*) [1])0x2ffb54);
    std::__cxx11::ostringstream::ostringstream(local_1f0);
    this = (ostream *)std::ostream::operator<<((ostream *)local_1f0,std::hex);
    std::ostream::operator<<(this,pXStack_18);
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[15],char_const(&)[11],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&gen_dispatch_table,(char (*) [15])"XrEyeTrackerFB",(char (*) [11])"eyeTracker",
               local_210);
    std::__cxx11::string::~string((string *)local_210);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&exists,
             (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&gen_dispatch_table);
    ApiDumpLayerRecordContent
              ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&exists);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&exists);
    contents.
    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         (**(code **)(mlock._8_8_ + 0x6d0))(pXStack_18);
    local_230._M_cur =
         (__node_type *)
         std::
         unordered_map<XrEyeTrackerFB_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrEyeTrackerFB_T_*>,_std::equal_to<XrEyeTrackerFB_T_*>,_std::allocator<std::pair<XrEyeTrackerFB_T_*const,_XrGeneratedDispatchTable_*>_>_>
         ::find(&g_eyetrackerfb_dispatch_map,&stack0xffffffffffffffe8);
    lock._8_8_ = std::
                 unordered_map<XrEyeTrackerFB_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrEyeTrackerFB_T_*>,_std::equal_to<XrEyeTrackerFB_T_*>,_std::allocator<std::pair<XrEyeTrackerFB_T_*const,_XrGeneratedDispatchTable_*>_>_>
                 ::end(&g_eyetrackerfb_dispatch_map);
    bVar1 = std::__detail::operator!=
                      (&local_230,
                       (_Node_iterator_base<std::pair<XrEyeTrackerFB_T_*const,_XrGeneratedDispatchTable_*>,_false>
                        *)&lock._M_owns);
    if (bVar1) {
      std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)local_248,&g_eyetrackerfb_dispatch_mutex);
      std::
      unordered_map<XrEyeTrackerFB_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrEyeTrackerFB_T_*>,_std::equal_to<XrEyeTrackerFB_T_*>,_std::allocator<std::pair<XrEyeTrackerFB_T_*const,_XrGeneratedDispatchTable_*>_>_>
      ::erase(&g_eyetrackerfb_dispatch_map,&stack0xffffffffffffffe8);
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_248);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1f0);
    bVar1 = false;
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&gen_dispatch_table);
  if (bVar1 == false) {
    eyeTracker_local._4_4_ =
         contents.
         super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return eyeTracker_local._4_4_;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrDestroyEyeTrackerFB(
    XrEyeTrackerFB eyeTracker) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_eyetrackerfb_dispatch_mutex);
            auto map_iter = g_eyetrackerfb_dispatch_map.find(eyeTracker);
            if (map_iter == g_eyetrackerfb_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrDestroyEyeTrackerFB", "");
        std::ostringstream oss_eyeTracker;
        oss_eyeTracker << std::hex << reinterpret_cast<const void*>(eyeTracker);
        contents.emplace_back("XrEyeTrackerFB", "eyeTracker", oss_eyeTracker.str());
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->DestroyEyeTrackerFB(eyeTracker);
        auto exists = g_eyetrackerfb_dispatch_map.find(eyeTracker);
        if (exists != g_eyetrackerfb_dispatch_map.end()) {
            std::unique_lock<std::mutex> lock(g_eyetrackerfb_dispatch_mutex);
            g_eyetrackerfb_dispatch_map.erase(eyeTracker);
        }
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}